

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void processCompileFeatures
               (cmTarget *tgt,
               vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *options,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueOptions,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugOptions)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  processCompileOptionsInternal
            (tgt,entries,options,uniqueOptions,dagChecker,config,debugOptions,"features",&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

static void processCompileFeatures(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &options,
      UNORDERED_SET<std::string> &uniqueOptions,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugOptions)
{
  processCompileOptionsInternal(tgt, entries, options, uniqueOptions,
                                dagChecker, config, debugOptions, "features",
                                std::string());
}